

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# symbolize.cc
# Opt level: O3

bool google::GetSectionHeaderByName(int fd,char *name,size_t name_len,Elf64_Shdr *out)

{
  int iVar1;
  ssize_t sVar2;
  size_t sVar3;
  ulong uVar4;
  Elf64_Shdr *pEVar5;
  long offset;
  ulong uVar6;
  bool bVar7;
  bool bVar8;
  Elf64_Ehdr elf_header;
  char header_name [64];
  Elf64_Shdr shstrtab;
  undefined1 local_f8 [40];
  long local_d0;
  ushort local_be;
  ushort local_bc;
  ushort local_ba;
  undefined1 local_b8 [72];
  undefined1 local_70 [24];
  long local_58;
  
  bVar7 = false;
  sVar2 = ReadFromOffset(fd,local_f8,0x40,0);
  if (sVar2 == 0x40) {
    sVar2 = ReadFromOffset(fd,local_70,0x40,(ulong)local_ba * (ulong)local_be + local_d0);
    if (sVar2 == 0x40) {
      uVar4 = (ulong)local_bc;
      if (uVar4 == 0) {
        bVar7 = false;
        pEVar5 = out;
      }
      else {
        bVar7 = true;
        offset = local_d0;
        uVar6 = 1;
        do {
          sVar2 = ReadFromOffset(fd,out,0x40,offset);
          if (sVar2 != 0x40) break;
          if (0x40 < name_len) {
            pEVar5 = (Elf64_Shdr *)0x0;
            RawLog__(1,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/huihut[P]glog/src/symbolize.cc"
                     ,0xf9,
                     "Section name \'%s\' is too long (%zu); section will not be found (even if present)."
                     ,name);
            bVar7 = true;
            goto LAB_0011d9d3;
          }
          sVar3 = ReadFromOffset(fd,local_b8,name_len,(ulong)out->sh_name + local_58);
          pEVar5 = (Elf64_Shdr *)(ulong)(sVar3 != 0xffffffffffffffff);
          if ((sVar3 == 0xffffffffffffffff) ||
             ((sVar3 == name_len && (iVar1 = bcmp(local_b8,name,name_len), iVar1 == 0))))
          goto LAB_0011d9d3;
          bVar7 = uVar6 < uVar4;
          offset = offset + (ulong)local_be;
          bVar8 = uVar6 != uVar4;
          uVar6 = uVar6 + 1;
        } while (bVar8);
        pEVar5 = (Elf64_Shdr *)0x0;
      }
LAB_0011d9d3:
      bVar7 = (bool)(bVar7 & (byte)pEVar5);
    }
    else {
      bVar7 = false;
    }
  }
  return bVar7;
}

Assistant:

bool GetSectionHeaderByName(int fd, const char *name, size_t name_len,
                            ElfW(Shdr) *out) {
  ElfW(Ehdr) elf_header;
  if (!ReadFromOffsetExact(fd, &elf_header, sizeof(elf_header), 0)) {
    return false;
  }

  ElfW(Shdr) shstrtab;
  off_t shstrtab_offset = (elf_header.e_shoff +
                           elf_header.e_shentsize * elf_header.e_shstrndx);
  if (!ReadFromOffsetExact(fd, &shstrtab, sizeof(shstrtab), shstrtab_offset)) {
    return false;
  }

  for (int i = 0; i < elf_header.e_shnum; ++i) {
    off_t section_header_offset = (elf_header.e_shoff +
                                   elf_header.e_shentsize * i);
    if (!ReadFromOffsetExact(fd, out, sizeof(*out), section_header_offset)) {
      return false;
    }
    char header_name[kMaxSectionNameLen];
    if (sizeof(header_name) < name_len) {
      RAW_LOG(WARNING, "Section name '%s' is too long (%" PRIuS "); "
              "section will not be found (even if present).", name, name_len);
      // No point in even trying.
      return false;
    }
    off_t name_offset = shstrtab.sh_offset + out->sh_name;
    ssize_t n_read = ReadFromOffset(fd, &header_name, name_len, name_offset);
    if (n_read == -1) {
      return false;
    } else if (n_read != name_len) {
      // Short read -- name could be at end of file.
      continue;
    }
    if (memcmp(header_name, name, name_len) == 0) {
      return true;
    }
  }
  return false;
}